

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O1

void __thiscall fmp4_stream::trun::print(trun *this)

{
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  long *plVar4;
  pointer psVar5;
  ulong uVar6;
  ulong uVar7;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"==================trun=================",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  lVar2 = std::cout;
  *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
       *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," magic conf                 ",0x1c);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  lVar2 = std::cout;
  *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
       *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," sample count:      ",0x14);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  lVar2 = std::cout;
  if (this->data_offset_present_ == true) {
    *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
         *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," data_offset:        ",0x15);
    plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->data_offset_);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
  }
  if (this->first_sample_flags_present_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," first sample flags:        ",0x1c);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  lVar2 = std::cout;
  *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
       *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," first sample flags present:  ",0x1e);
  poVar3 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  lVar2 = std::cout;
  *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
       *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," sample duration present: ",0x1a);
  poVar3 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  lVar2 = std::cout;
  *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
       *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," sample_size_present: ",0x16);
  poVar3 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  lVar2 = std::cout;
  *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
       *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," sample_flags_present: ",0x17);
  poVar3 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  lVar2 = std::cout;
  *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
       *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," sample_ct_offsets_present: ",0x1c);
  poVar3 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  psVar5 = (this->m_sentry).
           super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_sentry).
      super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar5) {
    uVar6 = 0;
    uVar7 = 1;
    do {
      (**psVar5[uVar6]._vptr_sample_entry)(psVar5 + uVar6);
      psVar5 = (this->m_sentry).
               super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar1 = uVar7 < (ulong)((long)(this->m_sentry).
                                    super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar5 >> 5);
      uVar6 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar1);
  }
  return;
}

Assistant:

void trun::print() const
	{
		std::cout << "==================trun=================" << std::endl;
		std::cout << std::setw(33) << std::left << " magic conf                 " << magic_conf_ << std::endl;
		std::cout << std::setw(33) << std::left << " sample count:      " << sample_count_ << std::endl;
		if (data_offset_present_)
			std::cout << std::setw(33) << std::left << " data_offset:        " << data_offset_ << std::endl;
		if (first_sample_flags_present_)
			std::cout << " first sample flags:        " << first_sample_flags_ << std::endl;

		std::cout << std::setw(33) << std::left << " first sample flags present:  " << first_sample_flags_present_ << std::endl;
		std::cout << std::setw(33) << std::left << " sample duration present: " << sample_duration_present_ << std::endl;
		std::cout << std::setw(33) << std::left << " sample_size_present: " << sample_size_present_ << std::endl;
		std::cout << std::setw(33) << std::left << " sample_flags_present: " << sample_flags_present_ << std::endl;
		std::cout << std::setw(33) << std::left << " sample_ct_offsets_present: " << sample_composition_time_offsets_present_ << std::endl;

		for (unsigned int i = 0; i < m_sentry.size(); i++)
			m_sentry[i].print();
	}